

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardize_data_array.h
# Opt level: O2

vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_> *
__thiscall
polyscope::
adaptorF_convertArrayOfVectorToStdVectorImpl<std::array<unsigned_long,2ul>,2u,std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>,void>
          (vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
           *__return_storage_ptr__,polyscope *this)

{
  long lVar1;
  pointer paVar2;
  size_t i;
  size_type sVar3;
  long lVar4;
  size_type __n;
  allocator_type local_19;
  
  __n = *(long *)(this + 8) - *(long *)this >> 3;
  std::vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>::
  vector(__return_storage_ptr__,__n,&local_19);
  lVar1 = *(long *)this;
  paVar2 = (__return_storage_ptr__->
           super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (sVar3 = 0; sVar3 != __n; sVar3 = sVar3 + 1) {
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      paVar2->_M_elems[lVar4] = (long)*(int *)(lVar1 + lVar4 * 4);
    }
    paVar2 = paVar2 + 1;
    lVar1 = lVar1 + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<O> adaptorF_convertArrayOfVectorToStdVectorImpl(PreferenceT<7>, const T& inputData) {
  size_t dataSize = adaptorF_size(inputData);
  std::vector<O> dataOut(dataSize);
  for (size_t i = 0; i < dataSize; i++) {
    for (size_t j = 0; j < D; j++) {
      dataOut[i][j] = inputData[i][j];
    }
  }
  return dataOut;
}